

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_signal_set.hpp
# Opt level: O2

void __thiscall
asio::basic_signal_set<asio::any_io_executor>::add
          (basic_signal_set<asio::any_io_executor> *this,int signal_number)

{
  error_code ec;
  error_code local_28;
  
  local_28._M_value = 0;
  local_28._M_cat = (error_category *)std::_V2::system_category();
  detail::signal_set_service::add
            ((this->impl_).service_,&(this->impl_).implementation_,signal_number,&local_28);
  detail::throw_error(&local_28,"add");
  return;
}

Assistant:

void add(int signal_number)
  {
    asio::error_code ec;
    impl_.get_service().add(impl_.get_implementation(), signal_number, ec);
    asio::detail::throw_error(ec, "add");
  }